

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPoolTest.cpp
# Opt level: O0

int main(void)

{
  ThreadFunc local_278;
  ThreadFunc local_258;
  ThreadFunc local_238;
  ThreadFunc local_218;
  ThreadFunc local_1f8;
  ThreadFunc local_1d8;
  ThreadFunc local_1b8;
  allocator<char> local_191;
  string local_190;
  undefined1 local_170 [8];
  ThreadPool pool;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  Thread thread;
  
  thread._76_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"TestThread",&local_81);
  std::function<void()>::function<void(&)(),void>((function<void()> *)&pool.running_,Foo);
  higan::Thread::Thread((Thread *)local_60,&local_80,(ThreadFunc *)&pool.running_);
  std::function<void_()>::~function((function<void_()> *)&pool.running_);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  higan::Thread::Start((Thread *)local_60);
  higan::Thread::~Thread((Thread *)local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"TestThreadPool",&local_191);
  higan::ThreadPool::ThreadPool((ThreadPool *)local_170,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  higan::ThreadPool::Init((ThreadPool *)local_170,2);
  std::function<void()>::function<void(&)(),void>((function<void()> *)&local_1b8,Foo);
  higan::ThreadPool::CallFunction((ThreadPool *)local_170,&local_1b8);
  std::function<void_()>::~function(&local_1b8);
  std::function<void()>::function<void(&)(),void>((function<void()> *)&local_1d8,Foo);
  higan::ThreadPool::CallFunction((ThreadPool *)local_170,&local_1d8);
  std::function<void_()>::~function(&local_1d8);
  std::function<void()>::function<void(&)(),void>((function<void()> *)&local_1f8,Foo);
  higan::ThreadPool::CallFunction((ThreadPool *)local_170,&local_1f8);
  std::function<void_()>::~function(&local_1f8);
  std::function<void()>::function<void(&)(),void>((function<void()> *)&local_218,Foo);
  higan::ThreadPool::CallFunction((ThreadPool *)local_170,&local_218);
  std::function<void_()>::~function(&local_218);
  std::function<void()>::function<void(&)(),void>((function<void()> *)&local_238,Foo);
  higan::ThreadPool::CallFunction((ThreadPool *)local_170,&local_238);
  std::function<void_()>::~function(&local_238);
  std::function<void()>::function<void(&)(),void>((function<void()> *)&local_258,Foo);
  higan::ThreadPool::CallFunction((ThreadPool *)local_170,&local_258);
  std::function<void_()>::~function(&local_258);
  std::function<void()>::function<void(&)(),void>((function<void()> *)&local_278,Foo);
  higan::ThreadPool::CallFunction((ThreadPool *)local_170,&local_278);
  std::function<void_()>::~function(&local_278);
  sleep(1);
  thread._76_4_ = 0;
  higan::ThreadPool::~ThreadPool((ThreadPool *)local_170);
  return thread._76_4_;
}

Assistant:

int main()
{

	{
		/**
		 * 测试detach 未被Join线程
		 */
		higan::Thread thread("TestThread", Foo);
		thread.Start();
	}


	higan::ThreadPool pool("TestThreadPool");
	pool.Init(2);

	pool.CallFunction(Foo);
	pool.CallFunction(Foo);
	pool.CallFunction(Foo);
	pool.CallFunction(Foo);
	pool.CallFunction(Foo);
	pool.CallFunction(Foo);
	pool.CallFunction(Foo);

	sleep(1);

	return 0;
}